

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O2

void helper_4xx_tlbwe_hi_ppc
               (CPUPPCState_conflict *env,target_ulong_conflict entry,target_ulong_conflict val)

{
  _func_void_DisasContext_ptr_int_int **cpu;
  ppcemb_tlb_t_conflict *ppVar1;
  ulong uVar2;
  uint addr;
  uint uVar3;
  CPUPPCState_conflict *__mptr;
  uint uVar4;
  
  cpu = &env[-1].spr_cb[0x1b7].hea_write;
  ppVar1 = (env->tlb).tlbe;
  uVar2 = (ulong)((entry & 0x3f) << 5);
  if ((*(byte *)((long)&ppVar1->prot + uVar2) & 8) != 0) {
    uVar4 = *(uint *)((long)&ppVar1->EPN + uVar2);
    uVar3 = *(int *)((long)&ppVar1->size + uVar2) + uVar4;
    for (; uVar4 < uVar3; uVar4 = uVar4 + 0x1000) {
      tlb_flush_page_ppc((CPUState_conflict *)cpu,uVar4);
    }
  }
  uVar4 = 0x400 << ((byte)(val >> 7) & 7) * '\x02';
  *(uint *)((long)&ppVar1->size + uVar2) = uVar4;
  if ((uVar4 < 0x1000 & (byte)val >> 6) != 1) {
    addr = -uVar4 & val;
    *(uint *)((long)&ppVar1->EPN + uVar2) = addr;
    uVar3 = *(uint *)((long)&ppVar1->prot + uVar2);
    if ((val & 0x40) == 0) {
      *(uint *)((long)&ppVar1->prot + uVar2) = uVar3 & 0xfffffff7;
      *(target_ulong_conflict *)((long)&ppVar1->PID + uVar2) = env->spr[0x3b1];
    }
    else {
      *(uint *)((long)&ppVar1->prot + uVar2) = uVar3 | 8;
      if ((val & 0x20) != 0) {
        cpu_abort_ppc((CPUState_conflict *)cpu,
                      "Little-endian TLB entries are not supported by now\n");
      }
      *(target_ulong_conflict *)((long)&ppVar1->PID + uVar2) = env->spr[0x3b1];
      uVar4 = uVar4 + addr;
      for (; addr < uVar4; addr = addr + 0x1000) {
        tlb_flush_page_ppc((CPUState_conflict *)cpu,addr);
      }
    }
    return;
  }
  cpu_abort_ppc((CPUState_conflict *)cpu,
                "TLB size %u < %u are not supported (%d)\nPlease implement TARGET_PAGE_BITS_VARY\n",
                (ulong)uVar4,0x1000);
}

Assistant:

void helper_4xx_tlbwe_hi(CPUPPCState *env, target_ulong entry,
                         target_ulong val)
{
    CPUState *cs = env_cpu(env);
    ppcemb_tlb_t *tlb;
    target_ulong page, end;

    LOG_SWTLB("%s entry %d val " TARGET_FMT_lx "\n", __func__, (int)entry,
              val);
    entry &= PPC4XX_TLB_ENTRY_MASK;
    tlb = &env->tlb.tlbe[entry];
    /* Invalidate previous TLB (if it's valid) */
    if (tlb->prot & PAGE_VALID) {
        end = tlb->EPN + tlb->size;
        LOG_SWTLB("%s: invalidate old TLB %d start " TARGET_FMT_lx " end "
                  TARGET_FMT_lx "\n", __func__, (int)entry, tlb->EPN, end);
        for (page = tlb->EPN; page < end; page += TARGET_PAGE_SIZE) {
            tlb_flush_page(cs, page);
        }
    }
    tlb->size = booke_tlb_to_page_size((val >> PPC4XX_TLBHI_SIZE_SHIFT)
                                       & PPC4XX_TLBHI_SIZE_MASK);
    /*
     * We cannot handle TLB size < TARGET_PAGE_SIZE.
     * If this ever occurs, we should implement TARGET_PAGE_BITS_VARY
     */
    if ((val & PPC4XX_TLBHI_V) && tlb->size < TARGET_PAGE_SIZE) {
        cpu_abort(cs, "TLB size " TARGET_FMT_lu " < %u "
                  "are not supported (%d)\n"
                  "Please implement TARGET_PAGE_BITS_VARY\n",
                  tlb->size, TARGET_PAGE_SIZE, (int)((val >> 7) & 0x7));
    }
    tlb->EPN = val & ~(tlb->size - 1);
    if (val & PPC4XX_TLBHI_V) {
        tlb->prot |= PAGE_VALID;
        if (val & PPC4XX_TLBHI_E) {
            /* XXX: TO BE FIXED */
            cpu_abort(cs,
                      "Little-endian TLB entries are not supported by now\n");
        }
    } else {
        tlb->prot &= ~PAGE_VALID;
    }
    tlb->PID = env->spr[SPR_40x_PID]; /* PID */
    LOG_SWTLB("%s: set up TLB %d RPN " TARGET_FMT_plx " EPN " TARGET_FMT_lx
              " size " TARGET_FMT_lx " prot %c%c%c%c PID %d\n", __func__,
              (int)entry, tlb->RPN, tlb->EPN, tlb->size,
              tlb->prot & PAGE_READ ? 'r' : '-',
              tlb->prot & PAGE_WRITE ? 'w' : '-',
              tlb->prot & PAGE_EXEC ? 'x' : '-',
              tlb->prot & PAGE_VALID ? 'v' : '-', (int)tlb->PID);
    /* Invalidate new TLB (if valid) */
    if (tlb->prot & PAGE_VALID) {
        end = tlb->EPN + tlb->size;
        LOG_SWTLB("%s: invalidate TLB %d start " TARGET_FMT_lx " end "
                  TARGET_FMT_lx "\n", __func__, (int)entry, tlb->EPN, end);
        for (page = tlb->EPN; page < end; page += TARGET_PAGE_SIZE) {
            tlb_flush_page(cs, page);
        }
    }
}